

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_instance.cpp
# Opt level: O2

XrResult ActiveLoaderInstance::Set
                   (unique_ptr<LoaderInstance,_std::default_delete<LoaderInstance>_>
                    *loader_instance,char *log_function_name)

{
  XrResult XVar1;
  allocator local_6a;
  allocator local_69;
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> local_68;
  string local_50;
  string local_30;
  
  anon_unknown.dwarf_43220::GetSetCurrentLoaderInstance();
  if ((__uniq_ptr_impl<LoaderInstance,_std::default_delete<LoaderInstance>_>)
      anon_unknown.dwarf_43220::GetSetCurrentLoaderInstance::current_loader_instance._M_t.
      super___uniq_ptr_impl<LoaderInstance,_std::default_delete<LoaderInstance>_>._M_t.
      super__Tuple_impl<0UL,_LoaderInstance_*,_std::default_delete<LoaderInstance>_>.
      super__Head_base<0UL,_LoaderInstance_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<LoaderInstance,_std::default_delete<LoaderInstance>_>)0x0) {
    anon_unknown.dwarf_43220::GetSetCurrentLoaderInstance();
    std::__uniq_ptr_impl<LoaderInstance,_std::default_delete<LoaderInstance>_>::operator=
              ((__uniq_ptr_impl<LoaderInstance,_std::default_delete<LoaderInstance>_> *)
               &anon_unknown.dwarf_43220::GetSetCurrentLoaderInstance::current_loader_instance,
               (__uniq_ptr_impl<LoaderInstance,_std::default_delete<LoaderInstance>_> *)
               loader_instance);
    XVar1 = XR_SUCCESS;
  }
  else {
    std::__cxx11::string::string((string *)&local_30,log_function_name,&local_69);
    std::__cxx11::string::string
              ((string *)&local_50,"Active XrInstance handle already exists",&local_6a);
    local_68.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    LoaderLogger::LogErrorMessage(&local_30,&local_50,&local_68);
    std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&local_68);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
    XVar1 = XR_ERROR_LIMIT_REACHED;
  }
  return XVar1;
}

Assistant:

XrResult Set(std::unique_ptr<LoaderInstance> loader_instance, const char* log_function_name) {
    if (GetSetCurrentLoaderInstance() != nullptr) {
        LoaderLogger::LogErrorMessage(log_function_name, "Active XrInstance handle already exists");
        return XR_ERROR_LIMIT_REACHED;
    }

    GetSetCurrentLoaderInstance() = std::move(loader_instance);
    return XR_SUCCESS;
}